

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O0

int LuaError(lua_State *L)

{
  dll_lua_pushstring p_Var1;
  undefined8 uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  allocator local_31;
  undefined1 local_30 [8];
  string msg;
  lua_State *L_local;
  
  msg.field_2._8_8_ = L;
  pcVar3 = (*lua_tolstring)(L,1,(size_t *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,pcVar3,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::operator+(&local_68,"[Emmy]",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  lua_getglobal((lua_State *)msg.field_2._8_8_,"error");
  uVar2 = msg.field_2._8_8_;
  p_Var1 = lua_pushstring;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  (*p_Var1)((lua_State *)uVar2,pcVar3);
  lua_call((lua_State *)msg.field_2._8_8_,1,0);
  std::__cxx11::string::~string((string *)local_30);
  return 0;
}

Assistant:

int LuaError(lua_State *L) {
	std::string msg = lua_tostring(L, 1);
	msg = "[Emmy]" + msg;
	lua_getglobal(L, "error");
	lua_pushstring(L, msg.c_str());
	lua_call(L, 1, 0);
	return 0;
}